

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseFlexBufferNumericConstant(Parser *this,Builder *builder)

{
  bool bVar1;
  Builder *in_RDX;
  double d;
  double local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = StringToFloatImpl<double>
                    (&local_40,
                     (char *)(builder->stack_).
                             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    flexbuffers::Builder::Double(in_RDX,local_40);
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  else {
    std::operator+(&local_38,"unexpected floating-point constant: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(builder->stack_).
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Error(this,(string *)builder);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFlexBufferNumericConstant(
    flexbuffers::Builder *builder) {
  double d;
  if (!StringToNumber(attribute_.c_str(), &d))
    return Error("unexpected floating-point constant: " + attribute_);
  builder->Double(d);
  return NoError();
}